

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O3

void Fra_CollectSuper_rec(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  size_t __size;
  int iVar1;
  void **ppvVar2;
  long lVar3;
  Aig_Obj_t *pAVar4;
  bool bVar5;
  
  if (((ulong)pObj & 1) == 0) {
    bVar5 = fFirst == 0;
    pAVar4 = pObj;
    do {
      while( true ) {
        if ((((uint)*(ulong *)&pObj->field_0x18 & 7) == 2) ||
           ((bool)(bVar5 & (*(ulong *)&pObj->field_0x18 & 0xffffff80) != 0))) goto LAB_0090ec84;
        if (fUseMuxes == 0) break;
        iVar1 = Aig_ObjIsMuxType(pObj);
        if (iVar1 != 0) goto LAB_0090ec84;
        Fra_CollectSuper_rec(pObj->pFanin0,vSuper,0,fUseMuxes);
        pObj = pObj->pFanin1;
        bVar5 = true;
        if (((ulong)pObj & 1) != 0) goto LAB_0090ec84;
      }
      fUseMuxes = 0;
      Fra_CollectSuper_rec(pAVar4->pFanin0,vSuper,0,0);
      pObj = pAVar4->pFanin1;
      bVar5 = true;
      pAVar4 = pObj;
    } while (((ulong)pObj & 1) == 0);
  }
LAB_0090ec84:
  iVar1 = vSuper->nSize;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if ((Aig_Obj_t *)vSuper->pArray[lVar3] == pObj) {
        return;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (iVar1 == vSuper->nCap) {
    if (iVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar2;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(__size);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar2;
      vSuper->nCap = iVar1 * 2;
    }
  }
  else {
    ppvVar2 = vSuper->pArray;
  }
  iVar1 = vSuper->nSize;
  vSuper->nSize = iVar1 + 1;
  ppvVar2[iVar1] = pObj;
  return;
}

Assistant:

void Fra_CollectSuper_rec( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || (!fFirst && Aig_ObjRefs(pObj) > 1) || 
         (fUseMuxes && Aig_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Fra_CollectSuper_rec( Aig_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Fra_CollectSuper_rec( Aig_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}